

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O2

void __thiscall
Catch::UnaryExpr<int>::streamReconstructedExpression(UnaryExpr<int> *this,ostream *os)

{
  string local_30;
  
  Detail::stringify<int>(&local_30,(int *)&(this->super_ITransientExpression).field_0xc);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }